

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_426e3::OpenCorruptStore::check_database_open
          (OpenCorruptStore *this,error_code err)

{
  error_code err_local;
  OpenCorruptStore *this_local;
  
  check_for_error<(anonymous_namespace)::OpenCorruptStore::check_database_open(pstore::error_code)const::__0>
            ((anon_class_8_1_8991fb9c)this,err);
  return;
}

Assistant:

void OpenCorruptStore::check_database_open (pstore::error_code err) const {
        check_for_error ([this] () { pstore::database{store_.file ()}; }, err);
    }